

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

ostream * miniros::operator<<(ostream *os,SteadyTime *rhs)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  uint *in_RSI;
  ostream *in_RDI;
  IosFlagSaver s;
  stream_t *in_stack_ffffffffffffff78;
  IosFlagSaver *in_stack_ffffffffffffff80;
  
  IosFlagSaver::IosFlagSaver(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  poVar3 = (ostream *)std::ostream::operator<<(in_RDI,*in_RSI);
  poVar3 = std::operator<<(poVar3,".");
  _Var2 = std::setw(9);
  poVar3 = std::operator<<(poVar3,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  std::ostream::operator<<(poVar3,in_RSI[1]);
  IosFlagSaver::~IosFlagSaver((IosFlagSaver *)0x55de4e);
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const SteadyTime &rhs)
  {
	IosFlagSaver s(os);
    os << rhs.sec << "." << std::setw(9) << std::setfill('0') << rhs.nsec;
    return os;
  }